

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::LargeHeapBlock::Check(LargeHeapBlock *this,bool expectFull,bool expectPending)

{
  code *pcVar1;
  bool bVar2;
  LargeObjectHeader **ppLVar3;
  LargeObjectHeader *pLVar4;
  undefined4 *puVar5;
  LargeObjectHeader *header;
  uint i;
  bool expectPending_local;
  bool expectFull_local;
  LargeHeapBlock *this_local;
  
  header._0_4_ = 0;
  do {
    if (this->allocCount <= (uint)header) {
      return;
    }
    ppLVar3 = HeaderList(this);
    if (ppLVar3[(uint)header] != (LargeObjectHeader *)0x0) {
      pLVar4 = (LargeObjectHeader *)((ulong)ppLVar3[(uint)header] & 0xfffffffffffffffe);
      if (((this->hasPartialFreeObjects & 1U) == 0) &&
         (ppLVar3 = HeaderList(this), pLVar4 != ppLVar3[(uint)header])) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x88d,"(this->hasPartialFreeObjects || header == this->HeaderList()[i])"
                           ,"this->hasPartialFreeObjects || header == this->HeaderList()[i]");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      if (pLVar4->objectIndex != (uint)header) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x88f,"(header->objectIndex == i)","header->objectIndex == i");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
    header._0_4_ = (uint)header + 1;
  } while( true );
}

Assistant:

void
LargeHeapBlock::Check(bool expectFull, bool expectPending)
{
    for (uint i = 0; i < allocCount; i++)
    {
        LargeObjectHeader * header = this->HeaderList()[i];
        if (header == nullptr)
        {
            continue;
        }
#if ENABLE_PARTIAL_GC && ENABLE_CONCURRENT_GC
        header = (LargeObjectHeader *)((size_t)header & ~PartialFreeBit);
        Assert(this->hasPartialFreeObjects || header == this->HeaderList()[i]);
#endif
        Assert(header->objectIndex == i);
    }
}